

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

uint8_t * __thiscall
FastPForLib::VByte::decodeFromByteArray
          (VByte *this,uint8_t *inbyte,size_t length,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  byte *pbVar5;
  uint32_t *puVar6;
  size_t sVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t v;
  
  if (length == 0) {
    sVar7 = 0;
  }
  else {
    pbVar5 = inbyte + length;
    puVar6 = out;
    while (pbVar1 = inbyte + 5, pbVar1 < pbVar5) {
      uVar8 = *inbyte & 0x7f;
      if ((char)*inbyte < '\0') {
        uVar8 = uVar8 | (inbyte[1] & 0x7f) << 7;
        if ((char)inbyte[1] < '\0') {
          uVar8 = uVar8 | (inbyte[2] & 0x7f) << 0xe;
          if ((char)inbyte[2] < '\0') {
            pbVar2 = inbyte + 3;
            inbyte = inbyte + 4;
            uVar8 = uVar8 | (*pbVar2 & 0x7f) << 0x15;
            if ((char)*pbVar2 < '\0') {
              uVar8 = uVar8 | (uint)*inbyte << 0x1c;
              inbyte = pbVar1;
            }
          }
          else {
            inbyte = inbyte + 3;
          }
        }
        else {
          inbyte = inbyte + 2;
        }
      }
      else {
        inbyte = inbyte + 1;
      }
      *puVar6 = uVar8;
      puVar6 = puVar6 + 1;
    }
LAB_00120461:
    if (inbyte < pbVar5) {
      uVar9 = 0;
      uVar8 = 0;
      do {
        if (pbVar5 <= inbyte) goto LAB_00120461;
        bVar3 = *inbyte;
        inbyte = inbyte + 1;
        uVar4 = uVar9 & 0x1f;
        uVar9 = uVar9 + 7;
        uVar8 = uVar8 + ((bVar3 & 0x7f) << uVar4);
      } while ((char)bVar3 < '\0');
      *puVar6 = uVar8;
      puVar6 = puVar6 + 1;
      goto LAB_00120461;
    }
    sVar7 = (long)puVar6 - (long)out >> 2;
  }
  *nvalue = sVar7;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     uint32_t *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const uint32_t *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 5) {
      uint8_t c;
      uint32_t v;

      c = inbyte[0];
      v = c & 0x7F;
      if (c < 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c < 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c < 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c < 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      inbyte += 5;
      v |= (c & 0x0F) << 28;
      *out++ = v;
    }
    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (uint32_t v = 0; endbyte > inbyte; shift += 7) {
        uint8_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c < 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }